

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

void __thiscall
helics::FederateInfo::loadInfoFromJson(FederateInfo *this,string *jsonString,bool runArgParser)

{
  pointer this_00;
  size_type sVar1;
  element_type *__a;
  byte in_DL;
  string *in_RSI;
  Error *clierror;
  ifstream file;
  istringstream jstringHelicsSub;
  istringstream jstringHelics;
  istringstream jstring;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  bool hasHelicsSubSection;
  bool hasHelicsSection;
  invalid_argument *iarg;
  json doc;
  FederateInfo *in_stack_00001758;
  App *in_stack_fffffffffffff778;
  App *in_stack_fffffffffffff780;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff788;
  element_type *in_stack_fffffffffffff790;
  char (*in_stack_fffffffffffff798) [7];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff7a0;
  allocator<char> *in_stack_fffffffffffff7b0;
  char *in_stack_fffffffffffff7b8;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffff7c0;
  undefined1 in_stack_fffffffffffff7c7;
  char *in_stack_fffffffffffff7c8;
  undefined7 in_stack_fffffffffffff7d0;
  allocator<char> local_7f9 [49];
  undefined8 local_7c8;
  undefined8 local_7c0;
  allocator<char> local_7b1 [49];
  undefined8 local_780;
  undefined8 local_778;
  long local_770 [49];
  string *in_stack_fffffffffffffa18;
  JsonBuffer *in_stack_fffffffffffffa48;
  FederateInfo *in_stack_fffffffffffffa50;
  istringstream local_568 [391];
  allocator<char> local_3e1 [49];
  istringstream local_3b0 [391];
  allocator<char> local_229 [49];
  istringstream local_1f8 [398];
  bool local_6a;
  byte local_69;
  JsonBuffer local_68 [8];
  json local_28;
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  fileops::loadJson(in_stack_fffffffffffffa18);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffff780);
  fileops::JsonBuffer::JsonBuffer(local_68,&local_28);
  loadJsonConfig(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  local_69 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::contains<const_char_(&)[7],_0>(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  local_6a = false;
  if ((bool)local_69) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)CONCAT17(local_69,in_stack_fffffffffffff7d0),in_stack_fffffffffffff7c8);
    in_stack_fffffffffffff7c7 =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
         ::contains<const_char_(&)[7],_0>(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    local_6a = (bool)in_stack_fffffffffffff7c7;
  }
  if ((local_11 & 1) != 0) {
    makeCLIApp(in_stack_00001758);
    this_00 = CLI::std::
              unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
              operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                          *)0x4040af);
    CLI::App::allow_extras(&this_00->super_App,true);
    sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
                 (char)((ulong)in_stack_fffffffffffff7b8 >> 0x38),
                 (size_type)in_stack_fffffffffffff7b0);
    if (sVar1 == 0xffffffffffffffff) {
      std::ifstream::ifstream(local_770,local_10,_S_in);
      CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
      operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *
                 )0x40448a);
      CLI::App::parse_from_stream(in_stack_fffffffffffff780,(istream *)in_stack_fffffffffffff778);
      if ((local_69 & 1) != 0) {
        std::ios::clear((int)local_770 + (int)*(undefined8 *)(local_770[0] + -0x18));
        CLI::std::fpos<__mbstate_t>::fpos
                  ((fpos<__mbstate_t> *)in_stack_fffffffffffff780,
                   (streamoff)in_stack_fffffffffffff778);
        std::istream::seekg(local_770,local_780,local_778);
        CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
        operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                    *)0x404506);
        CLI::App::get_config_formatter_base(in_stack_fffffffffffff778);
        in_stack_fffffffffffff790 =
             CLI::std::
             __shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x404525);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
                   in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
        CLI::ConfigBase::section
                  ((ConfigBase *)in_stack_fffffffffffff780,(string *)in_stack_fffffffffffff778);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff780);
        std::allocator<char>::~allocator(local_7b1);
        CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x404592);
        CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
        operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                    *)0x40459f);
        CLI::App::parse_from_stream(in_stack_fffffffffffff780,(istream *)in_stack_fffffffffffff778);
        if ((local_6a & 1U) != 0) {
          std::ios::clear((int)local_770 + (int)*(undefined8 *)(local_770[0] + -0x18));
          CLI::std::fpos<__mbstate_t>::fpos
                    ((fpos<__mbstate_t> *)in_stack_fffffffffffff780,
                     (streamoff)in_stack_fffffffffffff778);
          std::istream::seekg(local_770,local_7c8,local_7c0);
          CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
          ::operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x40461b);
          CLI::App::get_config_formatter_base(in_stack_fffffffffffff778);
          in_stack_fffffffffffff780 =
               (App *)CLI::std::
                      __shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x40463a);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),
                     in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
          CLI::ConfigBase::section
                    ((ConfigBase *)in_stack_fffffffffffff780,(string *)in_stack_fffffffffffff778);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff780);
          std::allocator<char>::~allocator(local_7f9);
          CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr
                    ((shared_ptr<CLI::ConfigBase> *)0x4046a7);
          CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
          ::operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x4046b4);
          CLI::App::parse_from_stream
                    (in_stack_fffffffffffff780,(istream *)in_stack_fffffffffffff778);
        }
      }
      std::ifstream::~ifstream(local_770);
    }
    else {
      std::__cxx11::istringstream::istringstream(local_1f8,local_10,_S_in);
      CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
      operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *
                 )0x404107);
      CLI::App::parse_from_stream(in_stack_fffffffffffff780,(istream *)in_stack_fffffffffffff778);
      if ((local_69 & 1) != 0) {
        CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
        operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                    *)0x404134);
        CLI::App::get_config_formatter_base(in_stack_fffffffffffff778);
        __a = CLI::std::
              __shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x404153);
        __s = local_229;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),(char *)__s,
                   (allocator<char> *)__a);
        CLI::ConfigBase::section
                  ((ConfigBase *)in_stack_fffffffffffff780,(string *)in_stack_fffffffffffff778);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff780);
        std::allocator<char>::~allocator(local_229);
        CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr((shared_ptr<CLI::ConfigBase> *)0x4041c0);
        std::__cxx11::istringstream::istringstream(local_3b0,local_10,_S_in);
        CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
        operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                    *)0x4041e9);
        CLI::App::parse_from_stream(in_stack_fffffffffffff780,(istream *)in_stack_fffffffffffff778);
        if ((local_6a & 1U) != 0) {
          CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
          ::operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x404216);
          CLI::App::get_config_formatter_base(in_stack_fffffffffffff778);
          CLI::std::__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<CLI::ConfigBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x404235);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7c7,in_stack_fffffffffffff7c0),(char *)__s,
                     (allocator<char> *)__a);
          CLI::ConfigBase::section
                    ((ConfigBase *)in_stack_fffffffffffff780,(string *)in_stack_fffffffffffff778);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff780);
          std::allocator<char>::~allocator(local_3e1);
          CLI::std::shared_ptr<CLI::ConfigBase>::~shared_ptr
                    ((shared_ptr<CLI::ConfigBase> *)0x4042a2);
          std::__cxx11::istringstream::istringstream(local_568,local_10,_S_in);
          CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
          ::operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x4042cb);
          CLI::App::parse_from_stream
                    (in_stack_fffffffffffff780,(istream *)in_stack_fffffffffffff778);
          std::__cxx11::istringstream::~istringstream(local_568);
        }
        std::__cxx11::istringstream::~istringstream(local_3b0);
      }
      std::__cxx11::istringstream::~istringstream(local_1f8);
    }
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
                in_stack_fffffffffffff790);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffff780);
  return;
}

Assistant:

void FederateInfo::loadInfoFromJson(const std::string& jsonString, bool runArgParser)
{
    nlohmann::json doc;
    try {
        doc = fileops::loadJson(jsonString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }
    loadJsonConfig(doc);
    const bool hasHelicsSection = doc.contains("helics");
    bool hasHelicsSubSection{false};
    if (hasHelicsSection) {
        hasHelicsSubSection = doc["helics"].contains("helics");
    }
    if (runArgParser) {
        auto app = makeCLIApp();
        app->allow_extras();
        try {
            if (jsonString.find('{') != std::string::npos) {
                std::istringstream jstring(jsonString);
                app->parse_from_stream(jstring);
                if (hasHelicsSection) {
                    app->get_config_formatter_base()->section("helics");
                    std::istringstream jstringHelics(jsonString);
                    app->parse_from_stream(jstringHelics);
                    if (hasHelicsSubSection) {
                        app->get_config_formatter_base()->section("helics.helics");
                        std::istringstream jstringHelicsSub(jsonString);
                        app->parse_from_stream(jstringHelicsSub);
                    }
                }
            } else {
                std::ifstream file(jsonString);
                app->parse_from_stream(file);
                if (hasHelicsSection) {
                    file.clear();
                    file.seekg(0);
                    app->get_config_formatter_base()->section("helics");
                    app->parse_from_stream(file);
                    if (hasHelicsSubSection) {
                        file.clear();
                        file.seekg(0);
                        app->get_config_formatter_base()->section("helics.helics");
                        app->parse_from_stream(file);
                    }
                }
            }
        }
        catch (const CLI::Error& clierror) {
            throw(InvalidIdentifier(clierror.what()));
        }
    }
}